

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O0

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
::FreeAllocation(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
                 *this,void *address)

{
  ThreadContext *this_00;
  TEmitBufferAllocation *local_38;
  TEmitBufferAllocation *allocation;
  TEmitBufferAllocation *previous;
  AutoRealOrFakeCriticalSection<FakeCriticalSection> autoCs;
  void *address_local;
  EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
  *this_local;
  
  autoCs.cs = (FakeCriticalSection *)address;
  AutoRealOrFakeCriticalSection<FakeCriticalSection>::AutoRealOrFakeCriticalSection
            ((AutoRealOrFakeCriticalSection<FakeCriticalSection> *)&previous,&this->criticalSection)
  ;
  allocation = (TEmitBufferAllocation *)0x0;
  local_38 = this->allocations;
  do {
    if (local_38 == (TEmitBufferAllocation *)0x0) {
      this_local._7_1_ = false;
LAB_00516114:
      AutoRealOrFakeCriticalSection<FakeCriticalSection>::~AutoRealOrFakeCriticalSection
                ((AutoRealOrFakeCriticalSection<FakeCriticalSection> *)&previous);
      return this_local._7_1_;
    }
    if (autoCs.cs == (FakeCriticalSection *)local_38->allocation->address) {
      if (allocation == (TEmitBufferAllocation *)0x0) {
        this->allocations = local_38->nextAllocation;
      }
      else {
        allocation->nextAllocation = local_38->nextAllocation;
      }
      if ((this->scriptContext != (ScriptContext *)0x0) && ((local_38->recorded & 1U) != 0)) {
        this_00 = Js::ScriptContext::GetThreadContext(this->scriptContext);
        ThreadContext::SubCodeSize(this_00,local_38->bytesCommitted);
      }
      SetValidCallTarget(this,local_38,autoCs.cs,false);
      if ((DAT_01ec73ca & 1) != 0) {
        Output::Trace(CustomHeapPhase,L"Freeing 0x%p, allocation: 0x%p\n",autoCs.cs,
                      local_38->allocation->address);
      }
      Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
      ::Free(&this->allocationHeap,local_38->allocation);
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (&this->allocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,local_38,
                 0x28);
      this_local._7_1_ = true;
      goto LAB_00516114;
    }
    allocation = local_38;
    local_38 = local_38->nextAllocation;
  } while( true );
}

Assistant:

bool
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::FreeAllocation(void* address)
{
#if PDATA_ENABLED && defined(_WIN32)
    DelayDeletingFunctionTable::Clear();
#endif

    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);

#if _M_ARM
    address = (void*)((uintptr_t)address & ~0x1); // clear the thumb bit
#endif
    TEmitBufferAllocation* previous = nullptr;
    TEmitBufferAllocation* allocation = allocations;
    while(allocation != nullptr)
    {
        if (address == allocation->allocation->address)
        {
            if (previous == nullptr)
            {
                this->allocations = allocation->nextAllocation;
            }
            else
            {
                previous->nextAllocation = allocation->nextAllocation;
            }

            if ((scriptContext != nullptr) && allocation->recorded)
            {
                this->scriptContext->GetThreadContext()->SubCodeSize(allocation->bytesCommitted);
            }

#if defined(_CONTROL_FLOW_GUARD) && !defined(_M_ARM)
            if (allocation->allocation->thunkAddress)
            {
                if (JITManager::GetJITManager()->IsJITServer())
                {
                    ((ServerThreadContext*)this->threadContext)->GetJITThunkEmitter()->FreeThunk(allocation->allocation->thunkAddress);
                }
                else
                {
                    ((ThreadContext*)this->threadContext)->GetJITThunkEmitter()->FreeThunk(allocation->allocation->thunkAddress);
                }
            }
            else
#endif
            {
                SetValidCallTarget(allocation, address, false);
            }
            VerboseHeapTrace(_u("Freeing 0x%p, allocation: 0x%p\n"), address, allocation->allocation->address);

            this->allocationHeap.Free(allocation->allocation);
            this->allocator->Free(allocation, sizeof(TEmitBufferAllocation));

            return true;
        }
        previous = allocation;
        allocation = allocation->nextAllocation;
    }
    return false;
}